

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestSemantic.cpp
# Opt level: O2

void __thiscall UnitTest_semantic14::Run(UnitTest_semantic14 *this)

{
  Terminator *pTVar1;
  Terminator *pTVar2;
  ReturnStatement *pRVar3;
  allocator local_61;
  string local_60;
  unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> local_40;
  allocator local_38 [32];
  
  std::__cxx11::string::string
            ((string *)&local_60,
             "function test()     local a = 1     a = f()     return function() return a end end",
             local_38);
  anon_unknown.dwarf_16d51::Semantic((anon_unknown_dwarf_16d51 *)&local_40,&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::string((string *)local_38,"a",&local_61);
  std::__cxx11::string::string((string *)&local_60,(string *)local_38);
  pTVar1 = ASTFind<luna::Terminator,FindName>(&local_40,(FindName *)&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)local_38);
  std::__cxx11::string::string((string *)local_38,"f",&local_61);
  std::__cxx11::string::string((string *)&local_60,(string *)local_38);
  pTVar2 = ASTFind<luna::Terminator,FindName>(&local_40,(FindName *)&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)local_38);
  if (pTVar1->scoping_ != LexicalScoping_Local) {
    std::__cxx11::string::string
              ((string *)&local_60,"\'a->scoping_ == luna::LexicalScoping_Local\'",local_38);
    UnitTestBase::Error(&this->super_UnitTestBase,&local_60);
    std::__cxx11::string::~string((string *)&local_60);
  }
  if (pTVar2->scoping_ != LexicalScoping_Global) {
    std::__cxx11::string::string
              ((string *)&local_60,"\'f->scoping_ == luna::LexicalScoping_Global\'",local_38);
    UnitTestBase::Error(&this->super_UnitTestBase,&local_60);
    std::__cxx11::string::~string((string *)&local_60);
  }
  pRVar3 = ASTFind<luna::ReturnStatement,AcceptAST>(&local_40,(AcceptAST *)&local_60);
  std::__cxx11::string::string((string *)local_38,"a",&local_61);
  std::__cxx11::string::string((string *)&local_60,(string *)local_38);
  pTVar1 = ASTFind<luna::Terminator,FindName>(&pRVar3->exp_list_,(FindName *)&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)local_38);
  if (pTVar1->scoping_ != LexicalScoping_Upvalue) {
    std::__cxx11::string::string
              ((string *)&local_60,"\'a2->scoping_ == luna::LexicalScoping_Upvalue\'",local_38);
    UnitTestBase::Error(&this->super_UnitTestBase,&local_60);
    std::__cxx11::string::~string((string *)&local_60);
  }
  if (local_40._M_t.super___uniq_ptr_impl<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>.
      _M_t.super__Tuple_impl<0UL,_luna::SyntaxTree_*,_std::default_delete<luna::SyntaxTree>_>.
      super__Head_base<0UL,_luna::SyntaxTree_*,_false>._M_head_impl !=
      (__uniq_ptr_impl<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>)0x0) {
    (*(*(_func_int ***)
        local_40._M_t.
        super___uniq_ptr_impl<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>._M_t.
        super__Tuple_impl<0UL,_luna::SyntaxTree_*,_std::default_delete<luna::SyntaxTree>_>.
        super__Head_base<0UL,_luna::SyntaxTree_*,_false>._M_head_impl)[1])();
  }
  return;
}

Assistant:

TEST_CASE(semantic14)
{
    auto ast = Semantic("function test() "
                        "    local a = 1 "
                        "    a = f() "
                        "    return function() return a end "
                        "end");

    auto a = ASTFind<luna::Terminator>(ast, FindName("a"));
    auto f = ASTFind<luna::Terminator>(ast, FindName("f"));
    EXPECT_TRUE(a->scoping_ == luna::LexicalScoping_Local);
    EXPECT_TRUE(f->scoping_ == luna::LexicalScoping_Global);

    auto ret = ASTFind<luna::ReturnStatement>(ast, AcceptAST());
    auto a2 = ASTFind<luna::Terminator>(ret->exp_list_, FindName("a"));
    EXPECT_TRUE(a2->scoping_ == luna::LexicalScoping_Upvalue);
}